

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultipleShootingSolver.cpp
# Opt level: O3

void __thiscall
iDynTree::optimalcontrol::MultipleShootingSolver::MultipleShootingTranscription::setHessianBlock
          (MultipleShootingTranscription *this,MatrixDynSize *hessian,MatrixDynSize *block,
          size_t startRow,size_t startCol)

{
  bool bVar1;
  bool *pbVar2;
  PointerType pdVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  DstEvaluatorType dstEvaluator;
  SrcEvaluatorType srcEvaluator;
  add_assign_op<double,_double> local_f9;
  ulong local_f8;
  long local_f0;
  PointerType local_e8;
  long local_e0;
  long local_d8;
  DstEvaluatorType local_d0;
  SrcEvaluatorType local_b8;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::add_assign_op<double,_double>,_0>
  local_a0;
  DstXprType local_80;
  
  pbVar2 = HessianBlocksMap::operator()(&this->m_hessianBlocks,startRow,startCol);
  bVar1 = *pbVar2;
  local_e8 = (PointerType)iDynTree::MatrixDynSize::data();
  iDynTree::MatrixDynSize::rows();
  local_f0 = iDynTree::MatrixDynSize::cols();
  local_f8 = startCol & 0xffffffff;
  local_80.
  super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
  .m_startRow.m_value = startRow;
  if (bVar1 == true) {
    pdVar3 = (PointerType)iDynTree::MatrixDynSize::data();
    lVar4 = iDynTree::MatrixDynSize::rows();
    lVar5 = iDynTree::MatrixDynSize::cols();
    lVar6 = iDynTree::MatrixDynSize::rows();
    local_80.
    super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
    .
    super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_1>
    .
    super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_0>
    .m_cols.m_value = iDynTree::MatrixDynSize::cols();
    local_d0.
    super_block_evaluator<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
    .
    super_mapbase_evaluator<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
    .m_data = pdVar3 + local_f8 + lVar5 * startRow;
    local_a0.m_dstExpr = &local_80;
    local_80.
    super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
    .m_startCol.m_value = local_f8;
    local_a0.m_src = &local_b8;
    local_b8.
    super_mapbase_evaluator<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
    .m_data = local_e8;
    local_b8.
    super_mapbase_evaluator<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
    .m_outerStride.m_value = local_f0;
    local_a0.m_dst = &local_d0;
    local_a0.m_functor = &local_f9;
    local_d0.
    super_block_evaluator<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
    .
    super_mapbase_evaluator<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
    .m_outerStride.m_value = lVar5;
    local_80.
    super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
    .
    super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_1>
    .
    super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_0>
    .m_data = local_d0.
              super_block_evaluator<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
              .
              super_mapbase_evaluator<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
              .m_data;
    local_80.
    super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
    .
    super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_1>
    .
    super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_0>
    .m_rows.m_value = lVar6;
    local_80.
    super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
    .m_xpr.
    super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
    super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
    m_data = pdVar3;
    local_80.
    super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
    .m_xpr.
    super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
    super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
    m_rows.m_value = lVar4;
    local_80.
    super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
    .m_xpr.
    super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
    super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
    m_cols.m_value = lVar5;
    local_80.
    super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
    .m_outerStride = lVar5;
    Eigen::internal::
    dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Map<const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::add_assign_op<double,_double>,_0>,_4,_0>
    ::run(&local_a0);
  }
  else {
    pdVar3 = (PointerType)iDynTree::MatrixDynSize::data();
    local_d8 = iDynTree::MatrixDynSize::rows();
    lVar4 = iDynTree::MatrixDynSize::cols();
    local_e0 = iDynTree::MatrixDynSize::rows();
    local_80.
    super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
    .
    super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_1>
    .
    super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_0>
    .m_cols.m_value = iDynTree::MatrixDynSize::cols();
    local_d0.
    super_block_evaluator<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
    .
    super_mapbase_evaluator<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
    .m_data = pdVar3 + local_f8 + lVar4 * startRow;
    local_a0.m_dstExpr = &local_80;
    local_80.
    super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
    .
    super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_1>
    .
    super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_0>
    .m_rows.m_value = local_e0;
    local_80.
    super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
    .m_xpr.
    super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
    super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
    m_rows.m_value = local_d8;
    local_80.
    super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
    .m_startCol.m_value = local_f8;
    local_a0.m_src = &local_b8;
    local_b8.
    super_mapbase_evaluator<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
    .m_data = local_e8;
    local_b8.
    super_mapbase_evaluator<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
    .m_outerStride.m_value = local_f0;
    local_a0.m_dst = &local_d0;
    local_a0.m_functor = &local_f9;
    local_d0.
    super_block_evaluator<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
    .
    super_mapbase_evaluator<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
    .m_outerStride.m_value = lVar4;
    local_80.
    super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
    .
    super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_1>
    .
    super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_0>
    .m_data = local_d0.
              super_block_evaluator<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
              .
              super_mapbase_evaluator<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
              .m_data;
    local_80.
    super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
    .m_xpr.
    super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
    super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
    m_data = pdVar3;
    local_80.
    super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
    .m_xpr.
    super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
    super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
    m_cols.m_value = lVar4;
    local_80.
    super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
    .m_outerStride = lVar4;
    Eigen::internal::
    dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Map<const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
    ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
           *)&local_a0);
    pbVar2 = HessianBlocksMap::operator()(&this->m_hessianBlocks,startRow,startCol);
    *pbVar2 = true;
  }
  return;
}

Assistant:

void setHessianBlock(MatrixDynSize& hessian, const MatrixDynSize& block, size_t startRow, size_t startCol) {
                if (m_hessianBlocks(startRow, startCol)) {
                    toEigen(hessian).block(static_cast<Eigen::Index>(startRow), static_cast<unsigned int>(startCol), block.rows(), block.cols()) += toEigen(block);
                } else {
                    toEigen(hessian).block(static_cast<Eigen::Index>(startRow), static_cast<unsigned int>(startCol), block.rows(), block.cols()) = toEigen(block);
                    m_hessianBlocks(startRow, startCol) = true;
                }
            }